

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel_internal.h
# Opt level: O1

void __thiscall
embree::sse2::__internal_two_level_builder__::
MeshBuilder<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive>::operator()
          (MeshBuilder<4,_embree::InstanceArray,_embree::InstanceArrayPrimitive> *this,void *bvh,
          InstanceArray *mesh,size_t geomID,GTypeMask gtype,bool useMortonBuilder,Builder **builder)

{
  ushort uVar1;
  uint uVar2;
  Builder *pBVar3;
  undefined8 *puVar4;
  uint geomID_00;
  undefined3 in_register_00000089;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  geomID_00 = (uint)geomID;
  if (CONCAT31(in_register_00000089,useMortonBuilder) == 0) {
    uVar1 = *(ushort *)&(mesh->super_Geometry).field_8.field_0x2;
    uVar2 = uVar1 & 7;
    if (uVar2 - 1 < 2) {
      pBVar3 = BVH4InstanceArrayMeshBuilderSAH(bvh,mesh,gtype,geomID_00,0);
      goto LAB_00dda4bd;
    }
    if (uVar2 == 3) {
      pBVar3 = BVH4InstanceArrayMeshRefitSAH(bvh,mesh,gtype,geomID_00,0);
      goto LAB_00dda4bd;
    }
    if ((uVar1 & 7) != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"invalid build quality","");
      *puVar4 = &PTR__rtcore_error_022018b0;
      *(undefined4 *)(puVar4 + 1) = 1;
      puVar4[2] = puVar4 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar4 + 2),local_40,local_40 + local_38)
      ;
      __cxa_throw(puVar4,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  pBVar3 = BVH4InstanceArrayMeshBuilderMortonGeneral(bvh,mesh,gtype,geomID_00,0);
LAB_00dda4bd:
  *builder = pBVar3;
  return;
}

Assistant:

void operator () (void* bvh, Mesh* mesh, size_t geomID, Geometry::GTypeMask gtype, bool useMortonBuilder, Builder*& builder) {
          if(useMortonBuilder) {
            builder = MortonBuilder<N,Mesh,Primitive>()(bvh,mesh,geomID,gtype);
            return;
          }
          switch (mesh->quality) {
            case RTC_BUILD_QUALITY_LOW:    builder = MortonBuilder<N,Mesh,Primitive>()(bvh,mesh,geomID,gtype); break;
            case RTC_BUILD_QUALITY_MEDIUM:
            case RTC_BUILD_QUALITY_HIGH:   builder = SAHBuilder<N,Mesh,Primitive>()(bvh,mesh,geomID,gtype); break;
            case RTC_BUILD_QUALITY_REFIT:  builder = RefitBuilder<N,Mesh,Primitive>()(bvh,mesh,geomID,gtype); break;
            default: throw_RTCError(RTC_ERROR_UNKNOWN,"invalid build quality");
          }
        }